

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find_widget_at.cpp
# Opt level: O0

bool anon_unknown.dwarf_191323::has_coordinates(Widget *w,size_t global_x,size_t global_y)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  undefined1 local_2d;
  bool within_south;
  bool within_north;
  bool within_east;
  bool within_west;
  size_t global_y_local;
  size_t global_x_local;
  Widget *w_local;
  
  bVar1 = cppurses::Widget::enabled(w);
  if (bVar1) {
    sVar2 = cppurses::Widget::inner_x(w);
    sVar3 = cppurses::Widget::inner_x(w);
    sVar4 = cppurses::Widget::width(w);
    sVar5 = cppurses::Widget::inner_y(w);
    sVar6 = cppurses::Widget::inner_y(w);
    sVar7 = cppurses::Widget::height(w);
    local_2d = false;
    if (((sVar2 <= global_x) && (local_2d = false, global_x < sVar3 + sVar4)) &&
       (local_2d = false, sVar5 <= global_y)) {
      local_2d = global_y < sVar6 + sVar7;
    }
    w_local._7_1_ = local_2d;
  }
  else {
    w_local._7_1_ = false;
  }
  return w_local._7_1_;
}

Assistant:

bool has_coordinates(const cppurses::Widget& w,
                     std::size_t global_x,
                     std::size_t global_y) {
    if (!w.enabled()) {
        return false;
    }
    const bool within_west = global_x >= w.inner_x();
    const bool within_east = global_x < (w.inner_x() + w.width());
    const bool within_north = global_y >= w.inner_y();
    const bool within_south = global_y < (w.inner_y() + w.height());
    return within_west && within_east && within_north && within_south;
}